

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3423.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementShellANCF_3423::SetupInitial(ChElementShellANCF_3423 *this,ChSystem *system)

{
  pointer pLVar1;
  iterator iVar2;
  long lVar3;
  size_t sVar4;
  pointer pMVar5;
  pointer pMVar6;
  ulong __new_size;
  pointer pLVar7;
  long lVar8;
  ulong uVar9;
  double dVar10;
  double local_38;
  double local_30;
  
  pLVar1 = (this->m_layers).
           super__Vector_base<chrono::fea::ChElementShellANCF_3423::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3423::Layer>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pLVar7 = (this->m_layers).
           super__Vector_base<chrono::fea::ChElementShellANCF_3423::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3423::Layer>_>
           ._M_impl.super__Vector_impl_data._M_start;
  __new_size = ((long)pLVar1 - (long)pLVar7 >> 5) * 0x2e8ba2e8ba2e8ba3;
  this->m_numLayers = __new_size;
  this->m_thickness = 0.0;
  if (pLVar1 != pLVar7) {
    lVar8 = 0;
    uVar9 = 0;
    do {
      Layer::SetupInitial((Layer *)((long)(pLVar7->m_T0).
                                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                          .m_storage.m_data.array + lVar8 + -0x40));
      pLVar7 = (this->m_layers).
               super__Vector_base<chrono::fea::ChElementShellANCF_3423::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3423::Layer>_>
               ._M_impl.super__Vector_impl_data._M_start;
      __new_size = this->m_numLayers;
      uVar9 = uVar9 + 1;
      lVar3 = lVar8 + -0x28;
      lVar8 = lVar8 + 0x160;
      this->m_thickness =
           *(double *)
            ((long)(pLVar7->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                   m_storage.m_data.array + lVar3) + this->m_thickness;
    } while (uVar9 < __new_size);
  }
  local_38 = -1.0;
  iVar2._M_current =
       (this->m_GaussZ).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->m_GaussZ).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (&this->m_GaussZ,iVar2,&local_38);
    __new_size = this->m_numLayers;
  }
  else {
    *iVar2._M_current = -1.0;
    (this->m_GaussZ).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  if (__new_size == 0) {
    __new_size = 0;
  }
  else {
    dVar10 = 0.0;
    lVar8 = 0x18;
    uVar9 = 0;
    do {
      dVar10 = dVar10 + *(double *)
                         ((long)&(((this->m_layers).
                                   super__Vector_base<chrono::fea::ChElementShellANCF_3423::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3423::Layer>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->m_T0).
                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                                 m_storage + lVar8 + -0x40);
      local_38 = (dVar10 + dVar10) / this->m_thickness + -1.0;
      iVar2._M_current =
           (this->m_GaussZ).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (this->m_GaussZ).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        local_30 = dVar10;
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&this->m_GaussZ,iVar2,&local_38);
        __new_size = this->m_numLayers;
        dVar10 = local_30;
      }
      else {
        *iVar2._M_current = local_38;
        (this->m_GaussZ).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 0x160;
    } while (uVar9 < __new_size);
  }
  std::
  vector<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_std::allocator<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>_>
  ::resize(&this->m_alphaEAS,__new_size);
  std::
  vector<Eigen::Matrix<double,_5,_5,_1,_5,_5>,_std::allocator<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>_>
  ::resize(&this->m_KalphaEAS,this->m_numLayers);
  sVar4 = this->m_numLayers;
  if (sVar4 != 0) {
    pMVar5 = (this->m_alphaEAS).
             super__Vector_base<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_std::allocator<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pMVar6 = (this->m_KalphaEAS).
             super__Vector_base<Eigen::Matrix<double,_5,_5,_1,_5,_5>,_std::allocator<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      (pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>).m_storage.m_data.array
      [0] = 0;
      *(double *)
       ((long)&(pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>).m_storage.
               m_data + 8) = 0.0;
      *(double *)
       ((long)&(pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>).m_storage.
               m_data + 0x10) = 0.0;
      *(double *)
       ((long)&(pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>).m_storage.
               m_data + 0x18) = 0.0;
      *(double *)
       ((long)&(pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>).m_storage.
               m_data + 0x20) = 0.0;
      *(double *)
       ((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>).m_storage.
               m_data + 0xc0) = 0.0;
      *(double *)
       ((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>).m_storage.
               m_data + 0x80) = 0.0;
      *(double *)
       ((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>).m_storage.
               m_data + 0x88) = 0.0;
      *(double *)
       ((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>).m_storage.
               m_data + 0x90) = 0.0;
      *(double *)
       ((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>).m_storage.
               m_data + 0x98) = 0.0;
      *(double *)
       ((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>).m_storage.
               m_data + 0xa0) = 0.0;
      *(double *)
       ((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>).m_storage.
               m_data + 0xa8) = 0.0;
      *(double *)
       ((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>).m_storage.
               m_data + 0xb0) = 0.0;
      *(double *)
       ((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>).m_storage.
               m_data + 0xb8) = 0.0;
      *(double *)
       ((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>).m_storage.
               m_data + 0x40) = 0.0;
      *(double *)
       ((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>).m_storage.
               m_data + 0x48) = 0.0;
      *(double *)
       ((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>).m_storage.
               m_data + 0x50) = 0.0;
      *(double *)
       ((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>).m_storage.
               m_data + 0x58) = 0.0;
      *(double *)
       ((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>).m_storage.
               m_data + 0x60) = 0.0;
      *(double *)
       ((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>).m_storage.
               m_data + 0x68) = 0.0;
      *(double *)
       ((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>).m_storage.
               m_data + 0x70) = 0.0;
      *(double *)
       ((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>).m_storage.
               m_data + 0x78) = 0.0;
      (pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>).m_storage.m_data.array
      [0] = 0;
      *(double *)
       ((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>).m_storage.
               m_data + 8) = 0.0;
      *(double *)
       ((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>).m_storage.
               m_data + 0x10) = 0.0;
      *(double *)
       ((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>).m_storage.
               m_data + 0x18) = 0.0;
      *(double *)
       ((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>).m_storage.
               m_data + 0x20) = 0.0;
      *(double *)
       ((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>).m_storage.
               m_data + 0x28) = 0.0;
      *(double *)
       ((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>).m_storage.
               m_data + 0x30) = 0.0;
      *(double *)
       ((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>).m_storage.
               m_data + 0x38) = 0.0;
      pMVar5 = pMVar5 + 1;
      pMVar6 = pMVar6 + 1;
      sVar4 = sVar4 - 1;
    } while (sVar4 != 0);
  }
  this->m_GaussScaling = this->m_lenX * this->m_lenY * this->m_thickness * 0.125;
  ComputeMassMatrix(this);
  ComputeGravityForceScale(this);
  return;
}

Assistant:

void ChElementShellANCF_3423::SetupInitial(ChSystem* system) {
    // Perform layer initialization and accumulate element thickness.
    m_numLayers = m_layers.size();
    m_thickness = 0;
    for (size_t kl = 0; kl < m_numLayers; kl++) {
        m_layers[kl].SetupInitial();
        m_thickness += m_layers[kl].Get_thickness();
    }

    // Loop again over the layers and calculate the range for Gauss integration in the
    // z direction (values in [-1,1]).
    m_GaussZ.push_back(-1);
    double z = 0;
    for (size_t kl = 0; kl < m_numLayers; kl++) {
        z += m_layers[kl].Get_thickness();
        m_GaussZ.push_back(2 * z / m_thickness - 1);
    }

    // Reserve space for the EAS parameters and Jacobians.
    m_alphaEAS.resize(m_numLayers);
    m_KalphaEAS.resize(m_numLayers);
    for (size_t i = 0; i < m_numLayers; i++) {
        m_alphaEAS[i].setZero();
        m_KalphaEAS[i].setZero();
    }

    // Cache the scaling factor (due to change of integration intervals)
    m_GaussScaling = (m_lenX * m_lenY * m_thickness) / 8;

    // Compute mass matrix and gravitational force scaling term (constant)
    ComputeMassMatrix();
    ComputeGravityForceScale();
}